

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math_test.cpp
# Opt level: O1

void __thiscall FloatInterval_Sqr_Test::TestBody(FloatInterval_Sqr_Test *this)

{
  bool bVar1;
  char *pcVar2;
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  FloatInterval b;
  AssertionResult gtest_ar;
  FloatInterval a;
  AssertHelper local_50;
  AssertHelper local_48;
  Interval<float> local_40;
  internal local_38 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  undefined1 local_28 [16];
  Interval<float> local_10;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  
  local_10.low = 1.75;
  local_10.high = 2.25;
  auVar3._0_8_ = pbrt::Interval<float>::operator*<float>
                           (&local_10,(Interval<float>)0x401000003fe00000);
  auVar3._8_56_ = extraout_var;
  local_40.low = 5.0625005;
  local_28 = auVar3._0_16_;
  local_50.data_._0_4_ = vextractps_avx(local_28,1);
  testing::internal::CmpHelperEQ<float,float>
            (local_38,"as.UpperBound()","at.UpperBound()",&local_40.low,(float *)&local_50);
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (local_30.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_30.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/math_test.cpp"
               ,0x308,pcVar2);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if (local_40 != (Interval<float>)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_40 != (Interval<float>)0x0)) {
        (**(code **)(*(long *)local_40 + 8))();
      }
      local_40.low = 0.0;
      local_40.high = 0.0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_30,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_40.low = 3.0624998;
  local_50.data_._0_4_ = local_28._0_4_;
  testing::internal::CmpHelperEQ<float,float>
            (local_38,"as.LowerBound()","at.LowerBound()",&local_40.low,(float *)&local_50);
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (local_30.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_30.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/math_test.cpp"
               ,0x309,pcVar2);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if (local_40 != (Interval<float>)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_40 != (Interval<float>)0x0)) {
        (**(code **)(*(long *)local_40 + 8))();
      }
      local_40.low = 0.0;
      local_40.high = 0.0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_30,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_40.low = -0.75;
  local_40.high = 1.25;
  auVar4._0_8_ = pbrt::Interval<float>::operator*<float>
                           (&local_40,(Interval<float>)0x3fa00000bf400000);
  auVar4._8_56_ = extraout_var_00;
  local_50.data_._0_4_ = 0x3fc80001;
  local_28 = auVar4._0_16_;
  local_48.data_._0_4_ = vextractps_avx(local_28,1);
  testing::internal::CmpHelperEQ<float,float>
            (local_38,"bs.UpperBound()","b2.UpperBound()",(float *)&local_50,(float *)&local_48);
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    if (local_30.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_30.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/math_test.cpp"
               ,0x30e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if (local_50.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_50.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_50.data_ + 8))();
      }
      local_50.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_30,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_50.data_ = local_50.data_ & 0xffffffff00000000;
  local_48.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<int,float>
            (local_38,"0","bs.LowerBound()",(int *)&local_50,(float *)&local_48);
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    if (local_30.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_30.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/math_test.cpp"
               ,0x30f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if (local_50.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_50.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_50.data_ + 8))();
      }
      local_50.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_30,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_50.data_._0_4_ = local_28._0_4_;
  local_48.data_._0_4_ = 0;
  testing::internal::CmpHelperLT<float,int>
            (local_38,"b2.LowerBound()","0",(float *)&local_50,(int *)&local_48);
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    if (local_30.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_30.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/math_test.cpp"
               ,0x310,pcVar2);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if (local_50.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_50.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_50.data_ + 8))();
      }
      local_50.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_30,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(FloatInterval, Sqr) {
    FloatInterval a = FloatInterval(1.75, 2.25);
    FloatInterval as = Sqr(a), at = a * a;
    EXPECT_EQ(as.UpperBound(), at.UpperBound());
    EXPECT_EQ(as.LowerBound(), at.LowerBound());

    // Straddle 0
    FloatInterval b = FloatInterval(-.75, 1.25);
    FloatInterval bs = Sqr(b), b2 = b * b;
    EXPECT_EQ(bs.UpperBound(), b2.UpperBound());
    EXPECT_EQ(0, bs.LowerBound());
    EXPECT_LT(b2.LowerBound(), 0);
}